

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

int64_t mtree_atol10(char **p)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  int64_t iVar5;
  ulong uVar6;
  char cVar7;
  long lVar8;
  uint uVar9;
  
  pcVar3 = *p;
  cVar2 = *pcVar3;
  uVar6 = 7;
  cVar7 = cVar2;
  if (cVar2 == '-') {
    *p = pcVar3 + 1;
    pcVar1 = pcVar3 + 1;
    uVar6 = 8;
    pcVar3 = pcVar3 + 1;
    cVar7 = *pcVar1;
  }
  uVar9 = (int)cVar7 - 0x30;
  if (uVar9 < 10) {
    lVar8 = 0;
    do {
      pcVar3 = pcVar3 + 1;
      if ((0xccccccccccccccc < lVar8) || (uVar6 < uVar9 && lVar8 == 0xccccccccccccccc)) {
        iVar5 = -0x8000000000000000;
        if (cVar2 != '-') {
          iVar5 = 0x7fffffffffffffff;
        }
        return iVar5;
      }
      lVar8 = (ulong)uVar9 + lVar8 * 10;
      *p = pcVar3;
      uVar9 = (int)*pcVar3 - 0x30;
    } while (uVar9 < 10);
  }
  else {
    lVar8 = 0;
  }
  lVar4 = -lVar8;
  if (cVar2 != '-') {
    lVar4 = lVar8;
  }
  return lVar4;
}

Assistant:

static int64_t
mtree_atol10(char **p)
{
	int64_t l, limit, last_digit_limit;
	int base, digit, sign;

	base = 10;

	if (**p == '-') {
		sign = -1;
		limit = ((uint64_t)(INT64_MAX) + 1) / base;
		last_digit_limit = ((uint64_t)(INT64_MAX) + 1) % base;
		++(*p);
	} else {
		sign = 1;
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;
	}

	l = 0;
	digit = **p - '0';
	while (digit >= 0 && digit < base) {
		if (l > limit || (l == limit && digit > last_digit_limit))
			return (sign < 0) ? INT64_MIN : INT64_MAX;
		l = (l * base) + digit;
		digit = *++(*p) - '0';
	}
	return (sign < 0) ? -l : l;
}